

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturing.hpp
# Opt level: O1

Vector3<float> __thiscall
eos::render::detail::tex2d_linear<float>
          (detail *this,Vector2<float> *imageTexCoord,uchar mipmap_index,Texture *texture)

{
  pointer pIVar1;
  long lVar2;
  Pixel<unsigned_char,_4> *pPVar3;
  int x;
  undefined7 in_register_00000011;
  int y;
  int iVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Vector3<float> VVar15;
  
  fVar12 = (imageTexCoord->super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage.
           m_data.array[0];
  x = (int)fVar12;
  fVar10 = (imageTexCoord->super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage.
           m_data.array[1];
  iVar5 = (int)fVar10;
  fVar12 = fVar12 - (float)(int)fVar12;
  fVar10 = fVar10 - (float)(int)fVar10;
  fVar14 = (1.0 - fVar12) * (1.0 - fVar10);
  fVar13 = (1.0 - fVar10) * fVar12;
  fVar7 = (1.0 - fVar12) * fVar10;
  pIVar1 = (texture->mipmaps).
           super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (ulong)(uint)((int)CONCAT71(in_register_00000011,mipmap_index) << 3) * 5;
  iVar4 = x;
  if (*(int *)((long)&pIVar1->width_ + lVar2) == x) {
    iVar4 = 0;
  }
  iVar6 = iVar5;
  if (*(int *)((long)&pIVar1->height_ + lVar2) == iVar5) {
    iVar6 = 0;
  }
  fVar11 = fVar10;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)((long)&pIVar1->height_ + lVar2)
                      ,iVar6,iVar4);
  fVar8 = (float)(pPVar3->data_)._M_elems[0] * fVar14;
  *(float *)this = fVar8;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),iVar6,
                      iVar4);
  fVar9 = (float)(pPVar3->data_)._M_elems[1] * fVar14;
  *(float *)(this + 4) = fVar9;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),iVar6,
                      iVar4);
  fVar14 = (float)(pPVar3->data_)._M_elems[2] * fVar14;
  *(float *)(this + 8) = fVar14;
  iVar6 = x + 1;
  pIVar1 = (texture->mipmaps).
           super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar4 = iVar6;
  if (iVar6 == *(int *)((long)&pIVar1->width_ + lVar2)) {
    iVar4 = 0;
  }
  y = iVar5;
  if (*(int *)((long)&pIVar1->height_ + lVar2) == iVar5) {
    y = 0;
  }
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)((long)&pIVar1->height_ + lVar2)
                      ,y,iVar4);
  fVar8 = (float)(pPVar3->data_)._M_elems[0] * fVar13 + fVar8;
  *(float *)this = fVar8;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),y,iVar4)
  ;
  fVar9 = (float)(pPVar3->data_)._M_elems[1] * fVar13 + fVar9;
  *(float *)(this + 4) = fVar9;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),y,iVar4)
  ;
  fVar14 = (float)(pPVar3->data_)._M_elems[2] * fVar13 + fVar14;
  *(float *)(this + 8) = fVar14;
  pIVar1 = (texture->mipmaps).
           super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(int *)((long)&pIVar1->width_ + lVar2) == x) {
    x = 0;
  }
  iVar5 = iVar5 + 1;
  iVar4 = iVar5;
  if (iVar5 == *(int *)((long)&pIVar1->height_ + lVar2)) {
    iVar4 = 0;
  }
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)((long)&pIVar1->height_ + lVar2)
                      ,iVar4,x);
  fVar8 = (float)(pPVar3->data_)._M_elems[0] * fVar7 + fVar8;
  *(float *)this = fVar8;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),iVar4,x)
  ;
  fVar9 = (float)(pPVar3->data_)._M_elems[1] * fVar7 + fVar9;
  *(float *)(this + 4) = fVar9;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),iVar4,x)
  ;
  fVar14 = (float)(pPVar3->data_)._M_elems[2] * fVar7 + fVar14;
  *(float *)(this + 8) = fVar14;
  pIVar1 = (texture->mipmaps).
           super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (iVar6 == *(int *)((long)&pIVar1->width_ + lVar2)) {
    iVar6 = 0;
  }
  if (iVar5 == *(int *)((long)&pIVar1->height_ + lVar2)) {
    iVar5 = 0;
  }
  fVar10 = fVar10 * fVar12;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)((long)&pIVar1->height_ + lVar2)
                      ,iVar5,iVar6);
  *(float *)this = (float)(pPVar3->data_)._M_elems[0] * fVar10 + fVar8;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),iVar5,
                      iVar6);
  *(float *)(this + 4) = (float)(pPVar3->data_)._M_elems[1] * fVar10 + fVar9;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),iVar5,
                      iVar6);
  VVar15.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (float)(pPVar3->data_)._M_elems[2] * fVar10 + fVar14;
  *(float *)(this + 8) =
       VVar15.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  VVar15.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0
  ;
  VVar15.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       fVar11;
  return (Vector3<float>)
         VVar15.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array;
}

Assistant:

inline Eigen::Vector3<T> tex2d_linear(const Eigen::Vector2<T>& imageTexCoord, unsigned char mipmap_index,
                                      const Texture& texture)
{
    const int x = (int)imageTexCoord[0];
    const int y = (int)imageTexCoord[1];
    const float alpha = imageTexCoord[0] - x;
    const float beta = imageTexCoord[1] - y;
    const float oneMinusAlpha = 1.0f - alpha;
    const float oneMinusBeta = 1.0f - beta;
    const float a = oneMinusAlpha * oneMinusBeta;
    const float b = alpha * oneMinusBeta;
    const float c = oneMinusAlpha * beta;
    const float d = alpha * beta;
    Eigen::Vector3<T> color;

    // int pixelIndex;
    // pixelIndex = getPixelIndex_wrap(x, y, texture->mipmaps[mipmapIndex].cols,
    // texture->mipmaps[mipmapIndex].rows);
    int pixelIndexCol = x;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    int pixelIndexRow = y;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    // std::cout << texture.mipmaps[mipmapIndex].cols << " " << texture.mipmaps[mipmapIndex].rows << " " <<
    // texture.mipmaps[mipmapIndex].channels() << std::endl;  cv::imwrite("mm.png",
    // texture.mipmaps[mipmapIndex]);
    color[0] = a * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] = a * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] = a * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    // pixelIndex = getPixelIndex_wrap(x + 1, y, texture.mipmaps[mipmapIndex].cols,
    // texture.mipmaps[mipmapIndex].rows);
    pixelIndexCol = x + 1;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    pixelIndexRow = y;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    color[0] += b * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] += b * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] += b * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    // pixelIndex = getPixelIndex_wrap(x, y + 1, texture.mipmaps[mipmapIndex].cols,
    // texture.mipmaps[mipmapIndex].rows);
    pixelIndexCol = x;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    pixelIndexRow = y + 1;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    color[0] += c * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] += c * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] += c * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    // pixelIndex = getPixelIndex_wrap(x + 1, y + 1, texture.mipmaps[mipmapIndex].cols,
    // texture.mipmaps[mipmapIndex].rows);
    pixelIndexCol = x + 1;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    pixelIndexRow = y + 1;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    color[0] += d * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] += d * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] += d * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    return color;
}